

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall diligent_spirv_cross::Compiler::build_combined_image_samplers(Compiler *this)

{
  uint32_t id;
  SPIRFunction *func;
  undefined1 local_c8 [8];
  CombinedImageSamplerHandler handler;
  Compiler *this_local;
  
  ParsedIR::
  for_each_typed_id<diligent_spirv_cross::SPIRFunction,diligent_spirv_cross::Compiler::build_combined_image_samplers()::__0>
            (&this->ir,
             (anon_class_1_0_00000001 *)
             ((long)&handler.functions.c.
                     super__Deque_base<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x1f));
  SmallVector<diligent_spirv_cross::CombinedImageSampler,_8UL>::clear
            (&this->combined_image_samplers);
  CombinedImageSamplerHandler::CombinedImageSamplerHandler
            ((CombinedImageSamplerHandler *)local_c8,this);
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this->ir).default_entry_point);
  func = get<diligent_spirv_cross::SPIRFunction>(this,id);
  traverse_all_reachable_opcodes(this,func,(OpcodeHandler *)local_c8);
  CombinedImageSamplerHandler::~CombinedImageSamplerHandler((CombinedImageSamplerHandler *)local_c8)
  ;
  return;
}

Assistant:

void Compiler::build_combined_image_samplers()
{
	ir.for_each_typed_id<SPIRFunction>([&](uint32_t, SPIRFunction &func) {
		func.combined_parameters.clear();
		func.shadow_arguments.clear();
		func.do_combined_parameters = true;
	});

	combined_image_samplers.clear();
	CombinedImageSamplerHandler handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
}